

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftlzw.c
# Opt level: O0

FT_Error ft_lzw_file_skip_output(FT_LZWFile zip,FT_ULong count)

{
  FT_ULong FVar1;
  FT_ULong numread;
  FT_ULong delta_1;
  FT_ULong delta;
  ulong uStack_18;
  FT_Error error;
  FT_ULong count_local;
  FT_LZWFile zip_local;
  
  delta_1 = (long)zip->limit - (long)zip->cursor;
  if (count <= delta_1) {
    delta_1 = count;
  }
  zip->cursor = zip->cursor + delta_1;
  zip->pos = delta_1 + zip->pos;
  uStack_18 = count - delta_1;
  while( true ) {
    if (uStack_18 == 0) {
      return 0;
    }
    numread = 0x1000;
    if (uStack_18 < 0x1000) {
      numread = uStack_18;
    }
    FVar1 = ft_lzwstate_io(&zip->lzw,(FT_Byte *)0x0,numread);
    if (FVar1 < numread) break;
    zip->pos = numread + zip->pos;
    uStack_18 = uStack_18 - numread;
  }
  return 0x55;
}

Assistant:

static FT_Error
  ft_lzw_file_skip_output( FT_LZWFile  zip,
                           FT_ULong    count )
  {
    FT_Error  error = FT_Err_Ok;


    /* first, we skip what we can from the output buffer */
    {
      FT_ULong  delta = (FT_ULong)( zip->limit - zip->cursor );


      if ( delta >= count )
        delta = count;

      zip->cursor += delta;
      zip->pos    += delta;

      count -= delta;
    }

    /* next, we skip as many bytes remaining as possible */
    while ( count > 0 )
    {
      FT_ULong  delta = FT_LZW_BUFFER_SIZE;
      FT_ULong  numread;


      if ( delta > count )
        delta = count;

      numread = ft_lzwstate_io( &zip->lzw, NULL, delta );
      if ( numread < delta )
      {
        /* not enough bytes */
        error = FT_THROW( Invalid_Stream_Operation );
        break;
      }

      zip->pos += delta;
      count    -= delta;
    }

    return error;
  }